

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O0

int isViableStructurePos(int structureType,Generator *g,int x,int z,uint32_t flags)

{
  StructureConfig config;
  uint32_t uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int biomeID;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  Pos PVar16;
  uint in_ECX;
  uint in_EDX;
  int *in_RSI;
  uint in_EDI;
  uint32_t in_R8D;
  StructureVariant sv_2;
  uint64_t m;
  uint64_t b;
  int cz;
  int cx;
  Pos p;
  int rz;
  int rx;
  int rz1;
  int rz0;
  int rx1;
  int rx0;
  int cz1;
  int cz0;
  int cx1;
  int cx0;
  StructureConfig vilconf;
  uint64_t rng;
  StructureVariant sv_1;
  size_t i;
  int vv [5];
  int data [2];
  Layer *entry;
  Layer lshore;
  Layer lbiome;
  StructureVariant sv;
  Pos rp;
  StructureConfig sc;
  int id;
  int sampleY;
  int sampleZ;
  int sampleX;
  int64_t chunkZ;
  int64_t chunkX;
  int viable;
  int approx;
  int32_t r_5;
  int32_t q_5;
  int32_t r_4;
  int32_t q_4;
  int32_t r_3;
  int32_t q_3;
  int32_t r_2;
  int32_t q_2;
  int32_t r_1;
  int32_t q_1;
  int32_t r;
  int32_t q;
  undefined8 in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd70;
  int in_stack_fffffffffffffd74;
  uint64_t in_stack_fffffffffffffd78;
  uint in_stack_fffffffffffffd84;
  uint n;
  int in_stack_fffffffffffffd88;
  uint in_stack_fffffffffffffd8c;
  uint structureType_00;
  int in_stack_fffffffffffffd90;
  uint in_stack_fffffffffffffd94;
  uint uVar17;
  uint in_stack_fffffffffffffd9c;
  float fVar18;
  int local_258;
  undefined8 in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  Generator *in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdcc;
  int in_stack_fffffffffffffdd0;
  short local_224;
  short local_222;
  short local_220;
  short local_21e;
  short local_21a;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  int in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe14;
  int in_stack_fffffffffffffe1c;
  int in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  int in_stack_fffffffffffffe30;
  int iVar19;
  int in_stack_fffffffffffffe34;
  int in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  char cStack_1b8;
  undefined8 in_stack_fffffffffffffe50;
  short local_19c;
  short local_198;
  short local_196;
  short local_192;
  ulong local_190;
  undefined8 local_188;
  Pos *in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  undefined8 in_stack_fffffffffffffe98;
  undefined8 uVar20;
  int in_stack_fffffffffffffea0;
  undefined1 local_118 [80];
  short local_c8;
  short local_c4;
  short local_c2;
  short local_be;
  int local_bc;
  int local_b8;
  char local_b0;
  uint32_t local_a8;
  int local_a4;
  uint local_a0;
  uint local_9c;
  long local_98;
  long local_90;
  int z_00;
  uint32_t local_64;
  
  iVar4 = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  z_00 = 0;
  local_64 = 0;
  local_90 = (long)((int)in_EDX >> 4);
  local_98 = (long)((int)in_ECX >> 4);
  if (in_RSI[1] == -1) {
    if ((in_EDI == 0x12) && (*in_RSI < 0x16)) {
      return 1;
    }
    if (*in_RSI < 0x13) {
      return 0;
    }
    if (in_EDI == 0xc) {
      return 1;
    }
    if (in_EDI != 0x12) {
      local_a4 = 0;
      if ((*in_RSI < 0x16) || (in_EDI != 0x13)) {
        local_9c = (int)((long)((int)in_EDX >> 4) << 2) + 2;
        local_a0 = (int)((long)((int)in_ECX >> 4) << 2) + 2;
      }
      else {
        getVariant((StructureVariant *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38)
                   ,in_stack_fffffffffffffe34,in_stack_fffffffffffffe30,
                   CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                   in_stack_fffffffffffffe24,in_stack_fffffffffffffe20,
                   (int)in_stack_fffffffffffffe50);
        local_9c = (uint)((local_90 * 0x20 + (long)((int)local_c8 << 1) + (long)local_c2 + -1) / 2
                         >> 2);
        local_a0 = (uint)((local_98 * 0x20 + (long)((int)local_c4 << 1) + (long)local_be + -1) / 2
                         >> 2);
        if (0x16 < *in_RSI) {
          local_a4 = 8;
        }
      }
      local_a8 = getBiomeAt(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,
                            in_stack_fffffffffffffdb8,
                            (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                            (int)in_stack_fffffffffffffdb0);
      iVar4 = isViableFeatureBiome
                        (in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,
                         in_stack_fffffffffffffd88);
      return iVar4;
    }
    iVar2 = getStructureConfig(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,
                               (StructureConfig *)in_stack_fffffffffffffdc0);
    iVar9 = (int)in_RSI;
    if (iVar2 == 0) {
      return 0;
    }
    uVar3 = (int)local_b0 << 4;
    uVar5 = 0;
    if ((int)(in_EDX ^ uVar3) < 0) {
      uVar5 = (uint)((int)in_EDX % (int)uVar3 != 0) << 0x18;
    }
    local_bc = (int)in_EDX / (int)uVar3 - (uVar5 >> 0x18);
    uVar3 = (int)local_b0 << 4;
    uVar5 = 0;
    if ((int)(in_ECX ^ uVar3) < 0) {
      uVar5 = (uint)((int)in_ECX % (int)uVar3 != 0) << 0x18;
    }
    local_b8 = (int)in_ECX / (int)uVar3 - (uVar5 >> 0x18);
    iVar4 = getStructurePos(in_stack_fffffffffffffea0,iVar4,
                            CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                            in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,
                            in_stack_fffffffffffffe80);
    if (iVar4 == 0) {
      return 1;
    }
    iVar4 = isViableStructurePos(iVar9,(Generator *)CONCAT44(in_EDX,in_ECX),in_R8D,z_00,local_64);
    return (uint)((iVar4 != 0 ^ 0xffU) & 1);
  }
  if (in_RSI[1] == 1) {
    if (in_EDI == 0x14) {
      if (*in_RSI < 0xc) {
        return 0;
      }
    }
    else {
      if (in_EDI != 0x15) {
        return 0;
      }
      if (*in_RSI < 0x10) {
        return 0;
      }
    }
    local_a8 = getBiomeAt(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,
                          in_stack_fffffffffffffdb8,(int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                          (int)in_stack_fffffffffffffdb0);
    iVar4 = isViableFeatureBiome
                      (in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88
                      );
    if (iVar4 == 0) {
      local_258 = 0;
    }
    else {
      local_258 = local_a8;
    }
    return local_258;
  }
  uVar20 = 0;
  if (*in_RSI < 0x16) {
    memcpy(local_118,in_RSI + 0x182,0x48);
    memcpy(&stack0xfffffffffffffea0,in_RSI + 0x26c,0x48);
    uVar20 = *(undefined8 *)(in_RSI + 0x506);
    *(undefined1 **)(in_RSI + 0x18e) = &stack0xfffffffffffffe90;
    *(code **)(in_RSI + 0x182) = mapViableBiome;
    *(undefined1 **)(in_RSI + 0x278) = &stack0xfffffffffffffe90;
    *(code **)(in_RSI + 0x26c) = mapViableShore;
  }
  iVar4 = (int)in_stack_fffffffffffffdb0;
  iVar2 = (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
  uVar1 = local_64;
  switch(in_EDI) {
  case 1:
  case 2:
  case 3:
    goto LAB_0010a424;
  case 4:
    if (*in_RSI < 0xc) goto LAB_0010b63e;
    goto LAB_0010a424;
  case 5:
    if (0x15 < *in_RSI) {
      local_188 = 0x200000001;
      for (local_190 = 0; local_190 < 5; local_190 = local_190 + 1) {
        if ((in_R8D == 0) || (in_R8D == *(uint32_t *)((long)&local_188 + local_190 * 4))) {
          getVariant((StructureVariant *)
                     CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                     in_stack_fffffffffffffe34,in_stack_fffffffffffffe30,
                     CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                     in_stack_fffffffffffffe24,in_stack_fffffffffffffe20,
                     (int)in_stack_fffffffffffffe50);
          local_9c = (uint)((local_90 * 0x20 + (long)((int)local_19c << 1) + (long)local_196 + -1) /
                            2 >> 2);
          local_a0 = (uint)((local_98 * 0x20 + (long)((int)local_198 << 1) + (long)local_192 + -1) /
                            2 >> 2);
          local_a4 = 0x4f;
          local_a8 = getBiomeAt(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,
                                in_stack_fffffffffffffdb8,
                                (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                                (int)in_stack_fffffffffffffdb0);
          if ((local_a8 == *(uint32_t *)((long)&local_188 + local_190 * 4)) ||
             ((local_a8 == 0xb1 && (*(int *)((long)&local_188 + local_190 * 4) == 1)))) {
            uVar1 = *(uint32_t *)((long)&local_188 + local_190 * 4);
            goto LAB_0010b627;
          }
        }
      }
      goto LAB_0010b63e;
    }
    if (*in_RSI == 0x12) {
      *(int **)(in_RSI + 0x506) = in_RSI + 0x3f8;
      local_9c = (int)(local_90 << 4) + 9;
      local_a0 = (int)(local_98 << 4) + 9;
    }
    else {
      *(int **)(in_RSI + 0x506) = in_RSI + 0x356;
      local_9c = (int)(local_90 << 2) + 2;
      local_a0 = (int)(local_98 << 2) + 2;
    }
    local_a8 = getBiomeAt(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,
                          in_stack_fffffffffffffdb8,iVar2,iVar4);
    if ((((int)local_a8 < 0) ||
        (iVar4 = isViableFeatureBiome
                           (in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,
                            in_stack_fffffffffffffd88), iVar4 == 0)) ||
       ((in_R8D != 0 && (local_a8 != in_R8D)))) goto LAB_0010b63e;
    uVar1 = local_a8;
    if (*in_RSI < 0xd) {
      local_9c = (int)(local_90 << 4) + 2;
      local_a0 = (int)(local_98 << 4) + 2;
      local_a8 = getBiomeAt(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,
                            in_stack_fffffffffffffdb8,
                            (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                            (int)in_stack_fffffffffffffdb0);
      if (((int)local_a8 < 0) ||
         (iVar4 = isViableFeatureBiome
                            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,
                             in_stack_fffffffffffffd88), uVar1 = local_a8, iVar4 == 0))
      goto LAB_0010b63e;
    }
    goto LAB_0010b627;
  case 6:
  case 7:
  case 0xe:
    if (*in_RSI < 0x10) goto LAB_0010b63e;
    goto LAB_0010a424;
  case 8:
    if (*in_RSI < 0xb) goto LAB_0010b63e;
    if (*in_RSI == 0xb) {
      local_a8 = getBiomeAt(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,
                            in_stack_fffffffffffffdb8,iVar2,iVar4);
      if ((int)local_a8 < 0) goto LAB_0010b63e;
      iVar4 = isDeepOcean(local_a8);
joined_r0x0010b1d6:
      if (iVar4 == 0) goto LAB_0010b63e;
    }
    else if (*in_RSI < 0x16) {
      *(int **)(in_RSI + 0x506) = in_RSI + 0x26c;
      local_a8 = getBiomeAt(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,
                            in_stack_fffffffffffffdb8,iVar2,iVar4);
      if ((int)local_a8 < 0) goto LAB_0010b63e;
      iVar4 = isDeepOcean(local_a8);
      goto joined_r0x0010b1d6;
    }
    local_9c = (int)(local_90 << 4) + 8;
    local_a0 = (int)(local_98 << 4) + 8;
    if ((*in_RSI < 0xc) || (0x15 < *in_RSI)) {
      if (0x15 < *in_RSI) {
        local_a8 = getBiomeAt(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,
                              in_stack_fffffffffffffdb8,
                              (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                              (int)in_stack_fffffffffffffdb0);
        iVar4 = isDeepOcean(local_a8);
        goto joined_r0x0010b2cd;
      }
    }
    else {
      iVar4 = areBiomesViable((Generator *)
                              CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                              in_stack_fffffffffffffe1c,
                              (int)((ulong)in_stack_fffffffffffffe14 >> 0x20),
                              (int)in_stack_fffffffffffffe14,in_stack_fffffffffffffe10,
                              CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                              CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                              in_stack_fffffffffffffe38);
joined_r0x0010b2cd:
      if (iVar4 == 0) goto LAB_0010b63e;
    }
    iVar4 = areBiomesViable((Generator *)
                            CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                            in_stack_fffffffffffffe1c,
                            (int)((ulong)in_stack_fffffffffffffe14 >> 0x20),
                            (int)in_stack_fffffffffffffe14,in_stack_fffffffffffffe10,
                            CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                            CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                            in_stack_fffffffffffffe38);
    break;
  case 9:
    if (*in_RSI < 0xe) goto LAB_0010b63e;
    if (*in_RSI < 0x16) {
      local_9c = (int)(local_90 << 4) + 8;
      local_a0 = (int)(local_98 << 4) + 8;
      iVar4 = areBiomesViable((Generator *)
                              CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                              in_stack_fffffffffffffe1c,
                              (int)((ulong)in_stack_fffffffffffffe14 >> 0x20),
                              (int)in_stack_fffffffffffffe14,in_stack_fffffffffffffe10,
                              CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                              CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                              in_stack_fffffffffffffe38);
    }
    else {
      local_9c = (int)(local_90 << 4) + 7;
      local_a0 = (int)(local_98 << 4) + 7;
      local_a8 = getBiomeAt(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,
                            in_stack_fffffffffffffdb8,iVar2,iVar4);
      if ((int)local_a8 < 0) goto LAB_0010b63e;
      iVar4 = isViableFeatureBiome
                        (in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,
                         in_stack_fffffffffffffd88);
    }
    break;
  case 10:
    if (*in_RSI < 0x11) goto LAB_0010b63e;
    setAttemptSeed((uint64_t *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                   (int)((ulong)in_stack_fffffffffffffd68 >> 0x20),(int)in_stack_fffffffffffffd68);
    iVar4 = nextInt((uint64_t *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                    in_stack_fffffffffffffd84);
    if ((iVar4 != 0) ||
       (iVar4 = getStructureConfig(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,
                                   (StructureConfig *)in_stack_fffffffffffffdc0), iVar4 == 0))
    goto LAB_0010b63e;
    uVar3 = (int)local_90 - 10;
    uVar5 = (int)local_90 + 10;
    uVar6 = (int)local_98 - 10;
    uVar7 = (int)local_98 + 10;
    uVar8 = (uint)cStack_1b8;
    iVar4 = (int)uVar3 / (int)uVar8;
    fVar18 = (float)(in_stack_fffffffffffffd9c & 0xffffff);
    if ((int)(uVar3 ^ uVar8) < 0) {
      fVar18 = (float)CONCAT13((int)uVar3 % (int)uVar8 != 0,(int3)in_stack_fffffffffffffd9c);
    }
    uVar8 = (uint)cStack_1b8;
    iVar2 = (int)uVar5 / (int)uVar8;
    uVar17 = in_stack_fffffffffffffd94 & 0xffffff;
    if ((int)(uVar5 ^ uVar8) < 0) {
      uVar17 = CONCAT13((int)uVar5 % (int)uVar8 != 0,(int3)in_stack_fffffffffffffd94);
    }
    iVar9 = iVar2 - (uVar17 >> 0x18);
    uVar8 = (uint)cStack_1b8;
    biomeID = (int)uVar6 / (int)uVar8;
    structureType_00 = in_stack_fffffffffffffd8c & 0xffffff;
    if ((int)(uVar6 ^ uVar8) < 0) {
      structureType_00 = CONCAT13((int)uVar6 % (int)uVar8 != 0,(int3)in_stack_fffffffffffffd8c);
    }
    iVar10 = biomeID - (structureType_00 >> 0x18);
    uVar8 = (uint)cStack_1b8;
    iVar11 = (int)uVar7 / (int)uVar8;
    n = in_stack_fffffffffffffd84 & 0xffffff;
    if ((int)(uVar7 ^ uVar8) < 0) {
      n = CONCAT13((int)uVar7 % (int)uVar8 != 0,(int3)in_stack_fffffffffffffd84);
    }
    iVar12 = iVar11 - (n >> 0x18);
    iVar15 = iVar4 - ((uint)fVar18 >> 0x18);
    for (; iVar19 = iVar15, iVar10 <= iVar12; iVar10 = iVar10 + 1) {
      for (; iVar15 <= iVar9; iVar15 = iVar15 + 1) {
        config.regionSize = (char)iVar4;
        config.chunkRange = (char)((uint)iVar4 >> 8);
        config.structType = (char)((uint)iVar4 >> 0x10);
        config.dim = (char)((uint)iVar4 >> 0x18);
        config.salt = uVar17;
        config.rarity = fVar18;
        PVar16 = getFeaturePos(config,in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                               in_stack_fffffffffffffd70);
        iVar13 = PVar16.x >> 4;
        iVar14 = PVar16.z >> 4;
        if ((((((int)uVar3 <= iVar13) && (iVar13 <= (int)uVar5)) && ((int)uVar6 <= iVar14)) &&
            (iVar14 <= (int)uVar7)) &&
           ((0x12 < *in_RSI ||
            (iVar13 = isViableStructurePos
                                ((int)in_RSI,(Generator *)CONCAT44(in_EDX,in_ECX),in_R8D,z_00,
                                 local_64), iVar13 != 0)))) goto LAB_0010b63e;
      }
      iVar15 = iVar19;
    }
    if (*in_RSI < 0x16) {
      if (*in_RSI < 0x13) {
        *(int **)(in_RSI + 0x506) = in_RSI + 0x3f8;
        local_9c = (int)(local_90 << 4) + 9;
        local_a0 = (int)(local_98 << 4) + 9;
      }
      else {
        *(int **)(in_RSI + 0x506) = in_RSI + 0x356;
        local_9c = (int)(local_90 << 2) + 2;
        local_a0 = (int)(local_98 << 2) + 2;
      }
    }
    else {
      chunkGenerateRnd(CONCAT44(n,iVar11),(int)(in_stack_fffffffffffffd78 >> 0x20),
                       (int)in_stack_fffffffffffffd78);
      iVar4 = nextInt((uint64_t *)CONCAT44(structureType_00,biomeID),n);
      switch(iVar4) {
      case 0:
        local_9c = 0xf;
        local_a0 = 0xf;
        break;
      case 1:
        local_9c = -0xf;
        local_a0 = 0xf;
        break;
      case 2:
        local_9c = -0xf;
        local_a0 = -0xf;
        break;
      case 3:
        local_9c = 0xf;
        local_a0 = -0xf;
        break;
      default:
        return 0;
      }
      local_9c = (uint)((local_90 * 0x20 + (long)(int)local_9c) / 2 >> 2);
      local_a0 = (uint)((local_98 * 0x20 + (long)(int)local_a0) / 2 >> 2);
    }
    local_a8 = getBiomeAt(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,
                          in_stack_fffffffffffffdb8,(int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                          (int)in_stack_fffffffffffffdb0);
    if ((int)local_a8 < 0) goto LAB_0010b63e;
    iVar4 = isViableFeatureBiome(iVar2,structureType_00,biomeID);
    break;
  case 0xb:
  case 0xc:
    if (*in_RSI < 0x13) goto LAB_0010b63e;
    goto LAB_0010b627;
  case 0xd:
    if (*in_RSI < 0x17) goto LAB_0010b63e;
    goto LAB_0010b4d7;
  case 0xf:
    goto LAB_0010b627;
  case 0x10:
    if (*in_RSI < 0x13) {
      *(int **)(in_RSI + 0x506) = in_RSI + 0x3f8;
      local_a0 = in_ECX;
      local_9c = in_EDX;
    }
    else {
      if (*in_RSI < 0x16) {
        *(int **)(in_RSI + 0x506) = in_RSI + 0x356;
      }
      local_9c = (int)in_EDX >> 2;
      local_a0 = (int)in_ECX >> 2;
    }
    local_a8 = getBiomeAt(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,
                          in_stack_fffffffffffffdb8,iVar2,iVar4);
    if ((int)local_a8 < 0) goto LAB_0010b63e;
    iVar4 = isViableFeatureBiome
                      (in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88
                      );
    break;
  case 0x11:
    if (*in_RSI < 0x15) goto LAB_0010b63e;
    goto LAB_0010b627;
  default:
    fprintf(_stderr,"isViableStructurePos: bad structure type %d or dimension %d\n",(ulong)in_EDI,
            (ulong)(uint)in_RSI[1]);
    goto LAB_0010b63e;
  case 0x17:
    if (*in_RSI < 0x19) goto LAB_0010b63e;
LAB_0010a424:
    if (*in_RSI < 0x13) {
      *(int **)(in_RSI + 0x506) = in_RSI + 0x3f8;
      local_9c = (int)(local_90 << 4) + 9;
      local_a0 = (int)(local_98 << 4) + 9;
    }
    else {
      if (*in_RSI < 0x16) {
        *(int **)(in_RSI + 0x506) = in_RSI + 0x356;
      }
      local_9c = (int)(local_90 << 2) + 2;
      local_a0 = (int)(local_98 << 2) + 2;
    }
    local_a8 = getBiomeAt(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,
                          in_stack_fffffffffffffdb8,iVar2,iVar4);
    if ((int)local_a8 < 0) goto LAB_0010b63e;
    iVar4 = isViableFeatureBiome
                      (in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88
                      );
    break;
  case 0x18:
    if (*in_RSI < 0x1a) goto LAB_0010b63e;
LAB_0010b4d7:
    getVariant((StructureVariant *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
               in_stack_fffffffffffffe34,in_stack_fffffffffffffe30,
               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
               in_stack_fffffffffffffe24,in_stack_fffffffffffffe20,(int)in_stack_fffffffffffffe50);
    local_9c = (uint)((local_90 * 0x20 + (long)((int)local_224 << 1) + (long)local_21e + -1) / 2 >>
                     2);
    local_a0 = (uint)((local_98 * 0x20 + (long)((int)local_220 << 1) + (long)local_21a + -1) / 2 >>
                     2);
    local_a4 = (int)local_222 >> 2;
    local_a8 = getBiomeAt(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,
                          in_stack_fffffffffffffdb8,(int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                          (int)in_stack_fffffffffffffdb0);
    if ((int)local_a8 < 0) goto LAB_0010b63e;
    iVar4 = isViableFeatureBiome
                      (in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88
                      );
  }
  uVar1 = local_64;
  if (iVar4 != 0) {
LAB_0010b627:
    local_64 = uVar1;
    if (local_64 == 0) {
      local_64 = 1;
    }
  }
LAB_0010b63e:
  if (*in_RSI < 0x16) {
    memcpy(in_RSI + 0x182,local_118,0x48);
    memcpy(in_RSI + 0x26c,&stack0xfffffffffffffea0,0x48);
    *(undefined8 *)(in_RSI + 0x506) = uVar20;
  }
  return local_64;
}

Assistant:

int isViableStructurePos(int structureType, Generator *g, int x, int z, uint32_t flags)
{
    int approx = 0; // enables approximation levels
    int viable = 0;

    int64_t chunkX = x >> 4;
    int64_t chunkZ = z >> 4;

    // Structures are positioned at the chunk origin, but the biome check is
    // performed near the middle of the chunk [(9,9) in 1.13, TODO: check 1.7]
    // In 1.16 the biome check is always performed at (2,2) with layer scale=4.
    int sampleX, sampleZ, sampleY;
    int id;


    if (g->dim == DIM_NETHER)
    {
        if (structureType == Fortress && g->mc <= MC_1_17)
            return 1;
        if (g->mc <= MC_1_15)
            return 0;
        if (structureType == Ruined_Portal_N)
            return 1;
        if (structureType == Fortress)
        {   // in 1.18+ fortresses generate everywhere, where bastions don't
            StructureConfig sc;
            if (!getStructureConfig(Fortress, g->mc, &sc))
                return 0;
            Pos rp = {
                floordiv(x, sc.regionSize << 4),
                floordiv(z, sc.regionSize << 4)
            };
            if (!getStructurePos(Bastion, g->mc, g->seed, rp.x, rp.z, &rp))
                return 1;
            return !isViableStructurePos(Bastion, g, x, z, flags);
        }
        sampleY = 0;
        if (g->mc >= MC_1_18 && structureType == Bastion)
        {
            StructureVariant sv;
            getVariant(&sv, Bastion, g->mc, g->seed, x, z, -1);
            sampleX = (chunkX*32 + 2*sv.x + sv.sx-1) / 2 >> 2;
            sampleZ = (chunkZ*32 + 2*sv.z + sv.sz-1) / 2 >> 2;
            if (g->mc >= MC_1_19_2)
                sampleY = 33 >> 2; // nether biomes don't actually vary in Y
        }
        else
        {
            sampleX = (chunkX * 4) + 2;
            sampleZ = (chunkZ * 4) + 2;
        }
        id = getBiomeAt(g, 4, sampleX, sampleY, sampleZ);
        return isViableFeatureBiome(g->mc, structureType, id);
    }
    else if (g->dim == DIM_END)
    {
        switch (structureType)
        {
        case End_City:
            if (g->mc <= MC_1_8) return 0;
            break;
        case End_Gateway:
            if (g->mc <= MC_1_12) return 0;
            break;
        default:
            return 0;
        }
        // End biomes vary only on a per-chunk scale (1:16)
        // voronoi pre-1.15 shouldn't matter for End Cities as the check will
        // be near the chunk center
        id = getBiomeAt(g, 16, chunkX, 0, chunkZ);
        return isViableFeatureBiome(g->mc, structureType, id) ? id : 0;
    }

    // Overworld

    Layer lbiome, lshore, *entry = 0;
    int data[2] = { structureType, g->mc };

    if (g->mc <= MC_1_17)
    {
        lbiome = g->ls.layers[L_BIOME_256];
        lshore = g->ls.layers[L_SHORE_16];
        entry = g->entry;

        g->ls.layers[L_BIOME_256].data = (void*) data;
        g->ls.layers[L_BIOME_256].getMap = mapViableBiome;
        g->ls.layers[L_SHORE_16].data = (void*) data;
        g->ls.layers[L_SHORE_16].getMap = mapViableShore;
    }

    switch (structureType)
    {
    case Trail_Ruins:
        if (g->mc <= MC_1_19) goto L_not_viable;
        goto L_feature;
    case Ocean_Ruin:
    case Shipwreck:
    case Treasure:
        if (g->mc <= MC_1_12) goto L_not_viable;
        goto L_feature;
    case Igloo:
        if (g->mc <= MC_1_8) goto L_not_viable;
        goto L_feature;
    case Desert_Pyramid:
    case Jungle_Pyramid:
    case Swamp_Hut:
L_feature:
        if (g->mc <= MC_1_15)
        {
            g->entry = &g->ls.layers[L_VORONOI_1];
            sampleX = chunkX * 16 + 9;
            sampleZ = chunkZ * 16 + 9;
        }
        else
        {
            if (g->mc <= MC_1_17)
                g->entry = &g->ls.layers[L_RIVER_MIX_4];
            sampleX = chunkX * 4 + 2;
            sampleZ = chunkZ * 4 + 2;
        }
        id = getBiomeAt(g, 0, sampleX, 319>>2, sampleZ);
        if (id < 0 || !isViableFeatureBiome(g->mc, structureType, id))
            goto L_not_viable;
        goto L_viable;

    case Desert_Well:
        if (g->mc <= MC_1_15)
        {
            g->entry = &g->ls.layers[L_VORONOI_1];
            sampleX = x;
            sampleZ = z;
        }
        else
        {
            if (g->mc <= MC_1_17)
                g->entry = &g->ls.layers[L_RIVER_MIX_4];
            sampleX = x >> 2;
            sampleZ = z >> 2;
        }
        id = getBiomeAt(g, 0, sampleX, 319>>2, sampleZ);
        if (id < 0 || !isViableFeatureBiome(g->mc, structureType, id))
            goto L_not_viable;
        goto L_viable;

    case Village:
        if (g->mc <= MC_1_17)
        {
            if (g->mc == MC_1_15)
            {   // exclusively in MC_1_15, villages used the same biome check
                // as other structures
                g->entry = &g->ls.layers[L_VORONOI_1];
                sampleX = chunkX * 16 + 9;
                sampleZ = chunkZ * 16 + 9;
            }
            else
            {
                g->entry = &g->ls.layers[L_RIVER_MIX_4];
                sampleX = chunkX * 4 + 2;
                sampleZ = chunkZ * 4 + 2;
            }
            id = getBiomeAt(g, 0, sampleX, 0, sampleZ);
            if (id < 0 || !isViableFeatureBiome(g->mc, structureType, id))
                goto L_not_viable;
            if (flags && (uint32_t) id != flags)
                goto L_not_viable;
            if (g->mc <= MC_1_9)
            {   // before MC_1_10 villages did not spread into invalid biomes,
                // which could cause them to fail to generate on the first
                // check at block (2, 2) in the starting chunk
                sampleX = chunkX * 16 + 2;
                sampleZ = chunkZ * 16 + 2;
                id = getBiomeAt(g, 1, sampleX, 0, sampleZ);
                if (id < 0 || !isViableFeatureBiome(g->mc, structureType, id))
                    goto L_not_viable;
            }
            viable = id; // biome for viablility, useful for further analysis
            goto L_viable;
        }
        else
        {   // In 1.18 village types are checked separtely...
            const int vv[] = { plains, desert, savanna, taiga, snowy_tundra };
            size_t i;
            for (i = 0; i < sizeof(vv)/sizeof(int); i++) {
                if (flags && flags != (uint32_t) vv[i])
                    continue;
                StructureVariant sv;
                getVariant(&sv, Village, g->mc, g->seed, x, z, vv[i]);
                sampleX = (chunkX*32 + 2*sv.x + sv.sx-1) / 2 >> 2;
                sampleZ = (chunkZ*32 + 2*sv.z + sv.sz-1) / 2 >> 2;
                sampleY = 319 >> 2;
                id = getBiomeAt(g, 0, sampleX, sampleY, sampleZ);
                if (id == vv[i] || (id == meadow && vv[i] == plains)) {
                    viable = vv[i];
                    goto L_viable;
                }
            }
            goto L_not_viable;
        }

    case Outpost:
    {
        if (g->mc <= MC_1_13)
            goto L_not_viable;
        uint64_t rng = g->seed;
        setAttemptSeed(&rng, chunkX, chunkZ);
        if (nextInt(&rng, 5) != 0)
            goto L_not_viable;
        // look for villages within 10 chunks
        StructureConfig vilconf;
        if (!getStructureConfig(Village, g->mc, &vilconf))
            goto L_not_viable;
        int cx0 = (chunkX-10), cx1 = (chunkX+10);
        int cz0 = (chunkZ-10), cz1 = (chunkZ+10);
        int rx0 = floordiv(cx0, vilconf.regionSize);
        int rx1 = floordiv(cx1, vilconf.regionSize);
        int rz0 = floordiv(cz0, vilconf.regionSize);
        int rz1 = floordiv(cz1, vilconf.regionSize);
        int rx, rz;
        for (rz = rz0; rz <= rz1; rz++)
        {
            for (rx = rx0; rx <= rx1; rx++)
            {
                Pos p = getFeaturePos(vilconf, g->seed, rx, rz);
                int cx = p.x >> 4, cz = p.z >> 4;
                if (cx >= cx0 && cx <= cx1 && cz >= cz0 && cz <= cz1)
                {
                    if (g->mc >= MC_1_16_1)
                        goto L_not_viable;
                    if (isViableStructurePos(Village, g, p.x, p.z, 0))
                        goto L_not_viable;
                }
            }
        }
        if (g->mc >= MC_1_18)
        {
            rng = chunkGenerateRnd(g->seed, chunkX, chunkZ);
            switch (nextInt(&rng, 4)) {
                case 0: sampleX = +15; sampleZ = +15; break;
                case 1: sampleX = -15; sampleZ = +15; break;
                case 2: sampleX = -15; sampleZ = -15; break;
                case 3: sampleX = +15; sampleZ = -15; break;
                default: return 0; // unreachable
            }
            sampleX = (chunkX * 32 + sampleX) / 2 >> 2;
            sampleZ = (chunkZ * 32 + sampleZ) / 2 >> 2;
        }
        else if (g->mc >= MC_1_16_1)
        {
            g->entry = &g->ls.layers[L_RIVER_MIX_4];
            sampleX = chunkX * 4 + 2;
            sampleZ = chunkZ * 4 + 2;
        }
        else
        {
            g->entry = &g->ls.layers[L_VORONOI_1];
            sampleX = chunkX * 16 + 9;
            sampleZ = chunkZ * 16 + 9;
        }
        id = getBiomeAt(g, 0, sampleX, 319>>2, sampleZ);
        if (id < 0 || !isViableFeatureBiome(g->mc, structureType, id))
            goto L_not_viable;
        goto L_viable;
    }

    case Monument:
        if (g->mc <= MC_1_7)
            goto L_not_viable;
        else if (g->mc == MC_1_8)
        {   // In 1.8 monuments require only a single deep ocean block.
            id = getBiomeAt(g, 1, chunkX * 16 + 8, 0, chunkZ * 16 + 8);
            if (id < 0 || !isDeepOcean(id))
                goto L_not_viable;
        }
        else if (g->mc <= MC_1_17)
        {   // Monuments require two viability checks with the ocean layer
            // branch => worth checking for potential deep ocean beforehand.
            g->entry = &g->ls.layers[L_SHORE_16];
            id = getBiomeAt(g, 0, chunkX, 0, chunkZ);
            if (id < 0 || !isDeepOcean(id))
                goto L_not_viable;
        }
        sampleX = chunkX * 16 + 8;
        sampleZ = chunkZ * 16 + 8;
        if (g->mc >= MC_1_9 && g->mc <= MC_1_17)
        {   // check for deep ocean center
            if (!areBiomesViable(g, sampleX, 63, sampleZ, 16, g_monument_biomes2, 0, approx))
                goto L_not_viable;
        }
        else if (g->mc >= MC_1_18)
        {   // check is done at y level of ocean floor - approx. with y = 36
            id = getBiomeAt(g, 4, sampleX>>2, 36>>2, sampleZ>>2);
            if (!isDeepOcean(id))
                goto L_not_viable;
        }
        if (areBiomesViable(g, sampleX, 63, sampleZ, 29, g_monument_biomes1, 0, approx))
            goto L_viable;
        goto L_not_viable;

    case Mansion:
        if (g->mc <= MC_1_10)
            goto L_not_viable;
        if (g->mc <= MC_1_17)
        {
            sampleX = chunkX * 16 + 8;
            sampleZ = chunkZ * 16 + 8;
            uint64_t b = (1ULL << dark_forest);
            uint64_t m = (1ULL << (dark_forest_hills-128));
            if (!areBiomesViable(g, sampleX, 0, sampleZ, 32, b, m, approx))
                goto L_not_viable;
        }
        else
        {   // In 1.18 the generation gets the minimum surface height among the
            // four structure corners (note structure has rotation).
            // This minimum height has to be y >= 60. The biome check is done
            // at the center position at that height.
            // TODO: get surface height
            sampleX = chunkX * 16 + 7;
            sampleZ = chunkZ * 16 + 7;
            id = getBiomeAt(g, 4, sampleX>>2, 319>>2, sampleZ>>2);
            if (id < 0 || !isViableFeatureBiome(g->mc, structureType, id))
                goto L_not_viable;
        }
        goto L_viable;

    case Ruined_Portal:
    case Ruined_Portal_N:
        if (g->mc <= MC_1_15)
            goto L_not_viable;
        goto L_viable;

    case Geode:
        if (g->mc <= MC_1_16)
            goto L_not_viable;
        goto L_viable;

    case Ancient_City:
        if (g->mc <= MC_1_18) goto L_not_viable;
        goto L_jigsaw;

    case Trial_Chambers:
        if (g->mc <= MC_1_20) goto L_not_viable;
L_jigsaw:
        {
            StructureVariant sv;
            getVariant(&sv, structureType, g->mc, g->seed, x, z, -1);
            sampleX = (chunkX*32 + 2*sv.x + sv.sx - 1) / 2 >> 2;
            sampleZ = (chunkZ*32 + 2*sv.z + sv.sz - 1) / 2 >> 2;
            sampleY = sv.y >> 2;
            id = getBiomeAt(g, 4, sampleX, sampleY, sampleZ);
        }
        if (id < 0 || !isViableFeatureBiome(g->mc, structureType, id))
            goto L_not_viable;
        goto L_viable;

    case Mineshaft:
        goto L_viable;

    default:
        fprintf(stderr,
                "isViableStructurePos: bad structure type %d or dimension %d\n",
                structureType, g->dim);
        goto L_not_viable;
    }

L_viable:
    if (!viable)
        viable = 1;
L_not_viable:
    if (g->mc <= MC_1_17)
    {
        g->ls.layers[L_BIOME_256] = lbiome;
        g->ls.layers[L_SHORE_16] = lshore;
        g->entry = entry;
    }
    return viable;
}